

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::LocalVarCheckVisitor::visit<slang::ast::MemberAccessExpression>
          (LocalVarCheckVisitor *this,MemberAccessExpression *expr)

{
  ExpressionKind EVar1;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar2;
  SyntaxNode **ppSVar3;
  CallExpression *call;
  
  if (this->anyErrors != false) {
    return;
  }
  EVar1 = (expr->super_Expression).kind;
  if ((EVar1 & ~IntegerLiteral) == NamedValue) {
    symbol = (variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_>)
             Expression::getSymbolReference(&expr->super_Expression,true);
    if ((symbol == (variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_>)
                   0x0) || ((symbol->super_Symbol).kind != ClassProperty)) goto LAB_007e883d;
    ppSVar3 = &symbol[1].super_Symbol.originatingSyntax;
  }
  else {
    if ((EVar1 != Call) || (*(char *)&expr[1].super_Expression.sourceRange.startLoc == '\x01'))
    goto LAB_007e883d;
    ppSVar2 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          *)&expr->member);
    symbol = *ppSVar2;
    ppSVar3 = (SyntaxNode **)&symbol->visibility;
  }
  checkVisibility(this,&symbol->super_Symbol,&expr->super_Expression,*(Visibility *)ppSVar3);
LAB_007e883d:
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::LocalVarCheckVisitor&>
            (expr->value_,expr->value_,this);
  return;
}

Assistant:

void visit(const T& expr) {
        if (anyErrors)
            return;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ValueExpressionBase::isKind(expr.kind)) {
                if (auto sym = expr.getSymbolReference();
                    sym && sym->kind == SymbolKind::ClassProperty) {
                    checkVisibility(*sym, expr, sym->template as<ClassPropertySymbol>().visibility);
                }
            }
            else if (expr.kind == ExpressionKind::Call) {
                auto& call = expr.template as<CallExpression>();
                if (!call.isSystemCall()) {
                    auto& sub = *std::get<const SubroutineSymbol*>(call.subroutine);
                    checkVisibility(sub, expr, sub.visibility);
                }
            }

            if constexpr (HasVisitExprs<T, LocalVarCheckVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }